

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_config.c
# Opt level: O1

int pt_filter_addr_check(pt_conf_addr_filter *filter,uint64_t addr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = true;
  if (filter == (pt_conf_addr_filter *)0x0) {
    iVar2 = -1;
  }
  else {
    lVar3 = 0;
    do {
      bVar5 = false;
      if (((uint)((filter->config).addr_cfg >> ((byte)lVar3 & 0x3f)) & 0xf) == 2) {
        bVar5 = addr <= *(ulong *)((long)filter->reserved + lVar3 * 4 + -0x38) &&
                *(ulong *)((long)filter->reserved + lVar3 * 4 + -0x40) <= addr;
      }
      if (bVar5) {
        iVar2 = 0;
        goto LAB_0010f1db;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    iVar2 = 1;
    bVar4 = false;
  }
LAB_0010f1db:
  iVar1 = -1;
  if (bVar4) {
    iVar1 = iVar2;
  }
  if (!(bool)(filter == (pt_conf_addr_filter *)0x0 | bVar4)) {
    lVar3 = 0;
    do {
      bVar4 = false;
      if (((uint)((filter->config).addr_cfg >> ((byte)lVar3 & 0x3f)) & 0xf) == 1) {
        bVar4 = addr <= *(ulong *)((long)filter->reserved + lVar3 * 4 + -0x38) &&
                *(ulong *)((long)filter->reserved + lVar3 * 4 + -0x40) <= addr;
      }
      if (bVar4) goto LAB_0010f257;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    lVar3 = 0;
    do {
      if (((uint)((filter->config).addr_cfg >> ((byte)lVar3 & 0x3f)) & 0xf) == 1) {
        return 0;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
LAB_0010f257:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int pt_filter_addr_check(const struct pt_conf_addr_filter *filter,
			 uint64_t addr)
{
	int status;

	status = pt_filter_check_cfg_stop(filter, addr);
	if (status <= 0)
		return status;

	return pt_filter_check_cfg_filter(filter, addr);
}